

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::updateMonthMenuNames(QCalendarWidgetPrivate *this)

{
  QCalendarWidget *key;
  QAction **ppQVar1;
  QCalendarWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QCalendarWidget *q;
  QString monthName;
  int i;
  int in_stack_ffffffffffffffac;
  QCalendarModel *locale;
  QCalendarWidgetPrivate *this_00;
  QLocale local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  key = q_func(in_RDI);
  for (local_c = 1; local_c < 0xd; local_c = local_c + 1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    locale = in_RDI->m_model;
    QWidget::locale((QWidget *)in_RDI);
    QtPrivate::QCalendarModel::monthName
              ((QCalendarModel *)in_RDI,(QLocale *)locale,in_stack_ffffffffffffffac);
    QLocale::~QLocale(&local_30);
    ppQVar1 = QMap<int,_QAction_*>::operator[]((QMap<int,_QAction_*> *)this_00,(int *)key);
    QAction::setText((QString *)*ppQVar1);
    QString::~QString((QString *)0x51c895);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::updateMonthMenuNames()
{
    Q_Q(QCalendarWidget);

    for (int i = 1; i <= 12; i++) {
        QString monthName(m_model->monthName(q->locale(), i));
        monthToAction[i]->setText(monthName);
    }
}